

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int gost_cipher_do_cfb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  uint uVar2;
  uchar *buf;
  uchar *iv;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  buf = (uchar *)EVP_CIPHER_CTX_buf_noconst();
  iv = (uchar *)EVP_CIPHER_CTX_iv_noconst(ctx);
  iVar1 = EVP_CIPHER_CTX_get_num(ctx);
  if (iVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar2 = EVP_CIPHER_CTX_get_num(ctx);
    uVar6 = (ulong)(int)uVar2;
    uVar5 = 0;
    uVar7 = uVar6;
    if (inl != 0 && uVar2 < 8) {
      do {
        iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
        if (iVar1 == 0) {
          buf[uVar7 + 8] = *in;
        }
        out[uVar5] = *in ^ buf[uVar7];
        iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
        if (iVar1 != 0) {
          buf[uVar7 + 8] = out[uVar5];
        }
        uVar6 = uVar7 + 1;
        uVar5 = uVar5 + 1;
        in = in + 1;
      } while ((uVar7 < 7) && (uVar7 = uVar6, uVar5 < inl));
      out = out + uVar5;
    }
    if (uVar6 != 8) goto LAB_001126f5;
    *(undefined8 *)iv = *(undefined8 *)(buf + 8);
    EVP_CIPHER_CTX_set_num(ctx,0);
  }
  for (; 7 < inl - uVar5; uVar5 = uVar5 + 8) {
    pvVar3 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    gost_crypt_mesh(pvVar3,iv,buf);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar1 == 0) {
      *(undefined8 *)iv = *(undefined8 *)in;
    }
    lVar4 = 0;
    do {
      out[lVar4] = in[lVar4] ^ buf[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar1 != 0) {
      *(undefined8 *)iv = *(undefined8 *)out;
    }
    in = in + 8;
    out = out + 8;
  }
  if (uVar5 < inl) {
    pvVar3 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    gost_crypt_mesh(pvVar3,iv,buf);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar1 == 0) {
      memcpy(buf + 8,in,inl - uVar5);
    }
    uVar6 = 0;
    if (uVar5 < inl) {
      do {
        out[uVar6] = in[uVar6] ^ buf[uVar6];
        uVar6 = uVar6 + 1;
      } while (inl - uVar5 != uVar6);
    }
    EVP_CIPHER_CTX_set_num(ctx,uVar6 & 0xffffffff);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar1 == 0) {
      return 1;
    }
    memcpy(buf + 8,out,uVar6);
    return 1;
  }
  uVar6 = 0;
LAB_001126f5:
  EVP_CIPHER_CTX_set_num(ctx,uVar6);
  return 1;
}

Assistant:

static int gost_cipher_do_cfb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                       const unsigned char *in, size_t inl)
{
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    size_t i = 0;
    size_t j = 0;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
/* process partial block if any */
    if (EVP_CIPHER_CTX_num(ctx)) {
        for (j = EVP_CIPHER_CTX_num(ctx), i = 0; j < 8 && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            if (!EVP_CIPHER_CTX_encrypting(ctx))
                buf[j + 8] = *in_ptr;
            *out_ptr = buf[j] ^ (*in_ptr);
            if (EVP_CIPHER_CTX_encrypting(ctx))
                buf[j + 8] = *out_ptr;
        }
        if (j == 8) {
            memcpy(iv, buf + 8, 8);
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, j);
            return 1;
        }
    }

    for (; (inl - i) >= 8; i += 8, in_ptr += 8, out_ptr += 8) {
        /*
         * block cipher current iv
         */
        gost_crypt_mesh(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        if (!EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(iv, in_ptr, 8);
        for (j = 0; j < 8; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        /* Encrypt */
        /* Next iv is next block of cipher text */
        if (EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(iv, out_ptr, 8);
    }
/* Process rest of buffer */
    if (i < inl) {
        gost_crypt_mesh(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        if (!EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(buf + 8, in_ptr, inl - i);
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, j);
        if (EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(buf + 8, out_ptr, j);
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }
    return 1;
}